

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall Centaurus::ATNMachine<wchar_t>::drop_passthrough_nodes(ATNMachine<wchar_t> *this)

{
  bool bVar1;
  ATNNodeType AVar2;
  size_type sVar3;
  ulong uVar4;
  reference this_00;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *this_01;
  reference rVar5;
  reference local_98;
  reference local_88;
  ATNTransition<wchar_t> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *__range5;
  ATNNode<wchar_t> *origin;
  int count;
  int where;
  ATNNode<wchar_t> *node;
  int i;
  allocator<bool> local_3a;
  bool local_39;
  undefined1 local_38 [8];
  vector<bool,_std::allocator<bool>_> mask;
  ATNMachine<wchar_t> *this_local;
  
  mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)this;
  sVar3 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
          size(&this->m_nodes);
  local_39 = true;
  std::allocator<bool>::allocator(&local_3a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_38,sVar3,&local_39,&local_3a);
  std::allocator<bool>::~allocator(&local_3a);
  node._0_4_ = 1;
  do {
    uVar4 = (ulong)(int)node;
    sVar3 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
            ::size(&this->m_nodes);
    if (sVar3 - 1 <= uVar4) {
      filter_nodes(this,(vector<bool,_std::allocator<bool>_> *)local_38);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_38);
      return;
    }
    _count = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ::at(&this->m_nodes,(long)(int)node);
    AVar2 = ATNNode<wchar_t>::type(_count);
    if (AVar2 == Blank) {
      origin._4_4_ = -1;
      origin._0_4_ = count_incoming_edges(this,(int)node,(int *)((long)&origin + 4));
      if ((int)origin == 1) {
        if (origin._4_4_ < 0) {
          __assert_fail("where >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                        ,0x179,
                        "void Centaurus::ATNMachine<wchar_t>::drop_passthrough_nodes() [TCHAR = wchar_t]"
                       );
        }
        this_00 = std::
                  vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                  ::at(&this->m_nodes,(long)origin._4_4_);
        this_01 = ATNNode<wchar_t>::get_transitions(_count);
        __end0 = std::
                 vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                 ::begin(this_01);
        t = (ATNTransition<wchar_t> *)
            std::
            vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
            ::end(this_01);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end0,(__normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
                                      *)&t);
          if (!bVar1) break;
          local_88 = __gnu_cxx::
                     __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
                     ::operator*(&__end0);
          ATNNode<wchar_t>::add_transition(this_00,local_88);
          __gnu_cxx::
          __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
          ::operator++(&__end0);
        }
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_38,(long)(int)node);
        local_98 = rVar5;
        std::_Bit_reference::operator=(&local_98,false);
      }
    }
    node._0_4_ = (int)node + 1;
  } while( true );
}

Assistant:

void drop_passthrough_nodes()
    {
        std::vector<bool> mask(m_nodes.size(), true);

        for (int i = 1; i < m_nodes.size() - 1; i++)
        {
            const ATNNode<TCHAR>& node = m_nodes.at(i);
            if (node.type() == ATNNodeType::Blank)
            {
                int where = -1;
                int count = count_incoming_edges(i, where);

                if (count == 1)
                {
                    assert(where >= 0);
                    ATNNode<TCHAR>& origin = m_nodes.at(where);
                    for (const auto& t : node.get_transitions())
                    {
                        origin.add_transition(t);
                    }
                    mask[i] = false;
                }
            }
        }

        filter_nodes(mask);
    }